

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_auto_possess.c
# Opt level: O1

BOOL compare_opcodes(PCRE2_SPTR8 code,BOOL utf,BOOL ucp,compile_block_8 *cb,uint32_t *base_list,
                    PCRE2_SPTR8 base_end,int *rec_limit)

{
  uint8_t **ppuVar1;
  PCRE2_SPTR8 pPVar2;
  char *pcVar3;
  byte bVar4;
  int iVar5;
  bool bVar6;
  pcre2_real_compile_context_8 **pppVar7;
  uint *puVar8;
  ushort uVar9;
  uint uVar10;
  BOOL BVar11;
  ulong uVar12;
  ulong uVar13;
  compile_block_8 *pcVar14;
  compile_block_8 *pcVar15;
  long lVar16;
  bool bVar17;
  compile_block_8 *fcc;
  undefined4 in_register_00000014;
  long lVar18;
  uint8_t **ppuVar19;
  long lVar20;
  int iVar21;
  PCRE2_SPTR8 pPVar22;
  uint uVar23;
  compile_block_8 *list_00;
  compile_block_8 *pcVar24;
  char cVar25;
  uint32_t list [8];
  uint in_stack_ffffffffffffff88;
  uint uVar26;
  undefined1 local_58 [40];
  
  lVar18 = CONCAT44(in_register_00000014,ucp);
  iVar5 = *(int *)base_end;
  uVar26 = iVar5 - 1;
  fcc = (compile_block_8 *)(ulong)uVar26;
  *(uint *)base_end = uVar26;
  uVar26 = 0;
  if (1 < iVar5) {
    ppuVar1 = &cb->lcc;
    bVar6 = false;
    list_00 = (compile_block_8 *)base_list;
    uVar26 = in_stack_ffffffffffffff88;
    do {
      bVar4 = *(byte *)&((compile_block_8 *)code)->cx;
      uVar12 = (ulong)bVar4;
      if (bVar4 == 0x76) {
        uVar12 = (ulong)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                        [uVar12];
LAB_001854dc:
        code = (PCRE2_SPTR8)((long)((compile_block_8 *)code)->small_ref_offset + (uVar12 - 0x58));
        cVar25 = '\x03';
        goto LAB_001859a5;
      }
      if (bVar4 == 0x77) {
        uVar9 = *(ushort *)((long)&((compile_block_8 *)code)->cx + 5);
        uVar12 = (ulong)(ushort)(uVar9 << 8 | uVar9 >> 8);
        goto LAB_001854dc;
      }
      while (bVar4 == 0x78) {
        uVar9 = *(ushort *)((long)&((compile_block_8 *)code)->cx + 1);
        fcc = (compile_block_8 *)(ulong)(ushort)(uVar9 << 8 | uVar9 >> 8);
        bVar4 = *(byte *)((long)(((compile_block_8 *)
                                 (((compile_block_8 *)(fcc->small_ref_offset + -0xb))->
                                  small_ref_offset + -0xb))->small_ref_offset + 0xfffffffffffffff5)
                         + (long)((compile_block_8 *)
                                 (((compile_block_8 *)
                                  (((compile_block_8 *)
                                   (((compile_block_8 *)code)->small_ref_offset + -0xb))->
                                   small_ref_offset + -0xb))->small_ref_offset + -0xb))->
                                 small_ref_offset + 0xffffffffffffffa8U);
        uVar12 = (ulong)bVar4;
        code = (PCRE2_SPTR8)
               ((long)(((compile_block_8 *)
                       (((compile_block_8 *)(fcc->small_ref_offset + -0xb))->small_ref_offset + -0xb
                       ))->small_ref_offset + 0xfffffffffffffff5) +
               (long)((compile_block_8 *)
                     (((compile_block_8 *)
                      (((compile_block_8 *)(((compile_block_8 *)code)->small_ref_offset + -0xb))->
                       small_ref_offset + -0xb))->small_ref_offset + -0xb))->small_ref_offset +
               0xffffffffffffffa8U);
      }
      uVar10 = (int)uVar12 - 0x79;
      if (0x1f < uVar10) {
LAB_001855b5:
        if ((int)uVar12 == 0) {
          uVar26 = (uint)(*(int *)((long)&cb->cx + 4) != 0);
          cVar25 = '\x01';
        }
        else {
          code = get_chr_property_list
                           (code,(BOOL)*(undefined8 *)(lVar18 + 0x10),
                            (BOOL)(compile_block_8 *)local_58,(uint8_t *)fcc,(uint32_t *)list_00);
          cVar25 = '\x01';
          if ((compile_block_8 *)code == (compile_block_8 *)0x0) {
            uVar26 = 0;
            code = (PCRE2_SPTR8)(compile_block_8 *)0x0;
          }
          else {
            iVar5 = *(int *)&cb->cx;
            fcc = (compile_block_8 *)(local_58 + 8);
            ppuVar19 = ppuVar1;
            list_00 = (compile_block_8 *)local_58;
            if ((iVar5 == 0x1d) ||
               (ppuVar19 = (uint8_t **)(local_58 + 8), fcc = (compile_block_8 *)ppuVar1,
               list_00 = cb, local_58._0_4_ == 0x1d)) {
              uVar10 = *(uint *)&list_00->cx;
              pcVar14 = (compile_block_8 *)code;
              if (list_00 != (compile_block_8 *)local_58) {
                pcVar14 = (compile_block_8 *)base_list;
              }
              if (((0x1f < uVar10) || ((0xa3be0fc0U >> (uVar10 & 0x1f) & 1) == 0)) &&
                 (1 < uVar10 - 0x6e)) {
LAB_00185bad:
                uVar26 = 0;
                goto LAB_001859a5;
              }
              do {
                uVar23 = *(uint *)ppuVar19;
                list_00 = (compile_block_8 *)(ulong)uVar23;
                switch(uVar10) {
                case 6:
                  if (uVar23 < 0x100) {
                    bVar4 = *(byte *)((long)list_00->small_ref_offset +
                                     *(long *)(lVar18 + 0x20) + -0x58) & 8;
                    goto joined_r0x00185771;
                  }
                  goto LAB_00185bad;
                case 7:
                  if (0xff < uVar23) break;
                  bVar4 = *(byte *)((long)list_00->small_ref_offset +
                                   *(long *)(lVar18 + 0x20) + -0x58) & 8;
                  goto joined_r0x001856ef;
                case 8:
                  if (uVar23 < 0x100) {
                    bVar4 = *(byte *)((long)list_00->small_ref_offset +
                                     *(long *)(lVar18 + 0x20) + -0x58) & 1;
                    goto joined_r0x00185771;
                  }
                  goto LAB_00185bad;
                case 9:
                  if (uVar23 < 0x100) {
                    bVar4 = *(byte *)((long)list_00->small_ref_offset +
                                     *(long *)(lVar18 + 0x20) + -0x58) & 1;
                    goto joined_r0x001856ef;
                  }
                  break;
                case 10:
                  if (0xff < uVar23) goto LAB_00185bad;
                  bVar4 = *(byte *)((long)list_00->small_ref_offset +
                                   *(long *)(lVar18 + 0x20) + -0x58) & 0x10;
joined_r0x00185771:
                  if (bVar4 == 0) goto LAB_00185bad;
                  break;
                case 0xb:
                  if (uVar23 < 0xff) {
                    bVar4 = *(byte *)((long)list_00->small_ref_offset +
                                     *(long *)(lVar18 + 0x20) + -0x58) & 0x10;
                    goto joined_r0x001856ef;
                  }
                  break;
                case 0xc:
                case 0xd:
                case 0xe:
                case 0xf:
                case 0x10:
                case 0x16:
                case 0x1a:
                case 0x1b:
                case 0x1c:
                case 0x1e:
                  goto switchD_0018567f_caseD_c;
                case 0x11:
                case 0x15:
                case 0x17:
                case 0x19:
                  if (((uVar23 - 10 < 4) || (uVar23 - 0x2028 < 2)) || (uVar23 == 0x85))
                  goto LAB_00185bad;
                  break;
                case 0x12:
                  if ((int)uVar23 < 0x2000) {
                    if ((int)uVar23 < 0xa0) {
                      if ((uVar23 != 9) && (uVar23 != 0x20)) goto LAB_00185bad;
                    }
                    else if ((uVar23 != 0xa0) && ((uVar23 != 0x1680 && (uVar23 != 0x180e))))
                    goto LAB_00185bad;
                  }
                  else if ((int)uVar23 < 0x202f) {
                    list_00 = (compile_block_8 *)(ulong)(uVar23 - 0x2000);
                    if (10 < uVar23 - 0x2000) goto LAB_00185bad;
                  }
                  else if (((uVar23 != 0x202f) && (uVar23 != 0x205f)) && (uVar23 != 0x3000))
                  goto LAB_00185bad;
                  break;
                case 0x13:
                  if ((int)uVar23 < 0x2000) {
                    if ((int)uVar23 < 0xa0) {
                      if ((uVar23 == 9) || (uVar23 == 0x20)) goto LAB_00185bad;
                    }
                    else if ((uVar23 == 0xa0) || ((uVar23 == 0x1680 || (uVar23 == 0x180e))))
                    goto LAB_00185bad;
                  }
                  else if ((int)uVar23 < 0x202f) {
                    list_00 = (compile_block_8 *)(ulong)(uVar23 - 0x2000);
                    if (uVar23 - 0x2000 < 0xb) goto LAB_00185bad;
                  }
                  else if (((uVar23 == 0x202f) || (uVar23 == 0x205f)) || (uVar23 == 0x3000))
                  goto LAB_00185bad;
                  break;
                case 0x14:
                  if (((3 < uVar23 - 10) && (1 < uVar23 - 0x2028)) && (uVar23 != 0x85))
                  goto LAB_00185bad;
                  break;
                case 0x18:
                  break;
                case 0x1d:
                  pcVar15 = fcc;
                  do {
                    pcVar24 = (compile_block_8 *)((long)&pcVar15->cx + 4);
                    if (uVar23 == *(uint *)&pcVar15->cx) goto LAB_00185bad;
                    pcVar15 = pcVar24;
                  } while (*(int *)&pcVar24->cx != -1);
                  break;
                case 0x1f:
                  pcVar15 = fcc;
                  do {
                    pcVar24 = pcVar15;
                    if (uVar23 == *(uint *)&pcVar15->cx) break;
                    pcVar24 = (compile_block_8 *)((long)&pcVar15->cx + 4);
                    pppVar7 = &pcVar15->cx;
                    pcVar15 = pcVar24;
                  } while (*(int *)((long)pppVar7 + 4) != -1);
                  if (*(int *)&pcVar24->cx == -1) goto LAB_00185bad;
                  break;
                default:
                  if ((uVar10 == 0x6f) && (0xff < uVar23)) goto LAB_00185bad;
switchD_0018567f_caseD_c:
                  if (uVar23 < 0x100) {
                    list_00 = (compile_block_8 *)(ulong)(uVar23 & 7);
                    bVar4 = *(byte *)((long)pcVar14 +
                                     ((ulong)(uVar23 >> 3) - (ulong)*(uint *)&fcc->cx)) >>
                            (uVar23 & 7) & 1;
joined_r0x001856ef:
                    if (bVar4 != 0) goto LAB_00185bad;
                  }
                }
                puVar8 = (uint *)((long)ppuVar19 + 4);
                ppuVar19 = (uint8_t **)((long)ppuVar19 + 4);
              } while (*puVar8 != 0xffffffff);
              cVar25 = local_58._4_4_ == 0;
            }
            else {
              if ((local_58._0_4_ == 0x6e || iVar5 == 0x6e) ||
                 ((utf == 0 && (iVar5 == 0x6f || local_58._0_4_ == 0x6f)))) {
                if ((iVar5 == 0x6e) ||
                   (fcc = (compile_block_8 *)code, ppuVar19 = ppuVar1, pcVar14 = cb,
                   uVar10 = local_58._8_4_, iVar5 == 0x6f && utf == 0)) {
                  fcc = (compile_block_8 *)base_list;
                  ppuVar19 = (uint8_t **)(local_58 + 8);
                  pcVar14 = (compile_block_8 *)local_58;
                  uVar10 = *(uint *)ppuVar1;
                }
                iVar21 = 0;
                list_00 = (compile_block_8 *)0x0;
                iVar5 = 0;
                switch(*(int *)&pcVar14->cx) {
                case 6:
                  iVar21 = 1;
                case 7:
                  lVar16 = *(long *)(lVar18 + 0x18) + 0x40;
                  break;
                case 8:
                  list_00 = (compile_block_8 *)0x1;
                case 9:
                  lVar16 = *(long *)(lVar18 + 0x18);
                  iVar21 = (int)list_00;
                  break;
                case 10:
                  iVar5 = 1;
                case 0xb:
                  iVar21 = iVar5;
                  lVar16 = *(long *)(lVar18 + 0x18) + 0xa0;
                  break;
                default:
                  uVar23 = *(int *)&pcVar14->cx - 0x6e;
                  list_00 = (compile_block_8 *)(ulong)uVar23;
                  if (1 < uVar23) goto LAB_00185bad;
                  pcVar15 = (compile_block_8 *)code;
                  if (pcVar14 != (compile_block_8 *)local_58) {
                    pcVar15 = (compile_block_8 *)base_list;
                  }
                  lVar16 = (long)pcVar15 - (ulong)*(uint *)ppuVar19;
                  iVar21 = 0;
                }
                fcc = (compile_block_8 *)((long)fcc - (ulong)uVar10);
                lVar20 = 0;
                if (iVar21 == 0) {
                  do {
                    if ((*(byte *)((long)fcc->small_ref_offset + lVar20 + -0x58) &
                        *(byte *)(lVar16 + lVar20)) != 0) goto LAB_00185bad;
                    lVar20 = lVar20 + 1;
                  } while (lVar20 != 0x20);
                }
                else {
                  do {
                    if ((~*(byte *)(lVar16 + lVar20) &
                        *(byte *)((long)fcc->small_ref_offset + lVar20 + -0x58)) != 0)
                    goto LAB_00185bad;
                    lVar20 = lVar20 + 1;
                  } while (lVar20 != 0x20);
                }
              }
              else {
                uVar10 = iVar5 - 6;
                uVar23 = local_58._0_4_ - 6;
                fcc = (compile_block_8 *)
                      CONCAT71((int7)((ulong)ppuVar1 >> 8),0x14 < uVar23 || 0x10 < uVar10);
                if ((0x14 < uVar23 || 0x10 < uVar10) ||
                   (fcc = (compile_block_8 *)(ulong)uVar23,
                   *(uint8_t *)
                    ((long)fcc->small_ref_offset + (long)((autoposstab + uVar10)[-5] + 0x11)) ==
                   '\0')) goto LAB_00185bad;
              }
              cVar25 = (local_58._4_4_ != 0) * '\x02' + '\x01';
            }
            if (local_58._4_4_ == 0) {
              uVar26 = 1;
            }
            fcc = (compile_block_8 *)(ulong)uVar26;
          }
        }
        goto LAB_001859a5;
      }
      fcc = (compile_block_8 *)0x15000;
      if ((0x15000U >> (uVar10 & 0x1f) & 1) != 0) {
        uVar9 = *(ushort *)((long)&((compile_block_8 *)code)->cx + 1);
        uVar13 = (ulong)(ushort)(uVar9 << 8 | uVar9 >> 8);
        pcVar14 = (compile_block_8 *)
                  ((long)((compile_block_8 *)code)->small_ref_offset +
                  ((ulong)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                          [uVar12] - 0x58));
        cVar25 = '\x03';
        if (*(char *)((long)((compile_block_8 *)code)->small_ref_offset + (uVar13 - 0x58)) == 'x') {
          lVar16 = (long)((compile_block_8 *)code)->small_ref_offset + (uVar13 - 0x58);
          code = (PCRE2_SPTR8)pcVar14;
          do {
            fcc = cb;
            list_00 = (compile_block_8 *)base_list;
            BVar11 = compare_opcodes(code,utf,ucp,cb,base_list,base_end,(int *)CONCAT44(utf,uVar26))
            ;
            if (BVar11 == 0) {
              uVar26 = 0;
              cVar25 = '\x01';
              goto LAB_001859a5;
            }
            code = (PCRE2_SPTR8)(lVar16 + 3);
            uVar12 = (ulong)(ushort)(*(ushort *)(lVar16 + 1) << 8 | *(ushort *)(lVar16 + 1) >> 8);
            pcVar3 = (char *)(lVar16 + uVar12);
            lVar16 = lVar16 + uVar12;
          } while (*pcVar3 == 'x');
          bVar6 = true;
        }
        else {
          bVar6 = true;
          code = (PCRE2_SPTR8)pcVar14;
          cVar25 = '\x03';
        }
        goto LAB_001859a5;
      }
      fcc = (compile_block_8 *)0x9;
      if ((9U >> (uVar10 & 0x1f) & 1) == 0) {
        fcc = (compile_block_8 *)0xc0000000;
        if ((0xc0000000U >> (uVar10 & 0x1f) & 1) == 0) goto LAB_001855b5;
        cVar25 = '\x01';
        uVar10 = *(byte *)((long)&((compile_block_8 *)code)->cx + 1) - 0x85;
        if ((4 < uVar10) || (fcc = (compile_block_8 *)0x15, (0x15U >> (uVar10 & 0x1f) & 1) == 0))
        goto switchD_00185598_caseD_4;
        pPVar22 = (PCRE2_SPTR8)((long)&((compile_block_8 *)code)->cx + 1);
        do {
          uVar9 = *(ushort *)(pPVar22 + 1) << 8 | *(ushort *)(pPVar22 + 1) >> 8;
          pPVar2 = pPVar22 + uVar9;
          pPVar22 = pPVar22 + uVar9;
        } while (*pPVar2 == 'x');
        fcc = cb;
        list_00 = (compile_block_8 *)base_list;
        BVar11 = compare_opcodes(pPVar22 + 3,utf,ucp,cb,base_list,base_end,
                                 (int *)CONCAT44(utf,uVar26));
        if (BVar11 == 0) {
          uVar26 = 0;
        }
        else {
          code = (PCRE2_SPTR8)
                 ((long)((compile_block_8 *)code)->small_ref_offset +
                 ((ulong)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                         [uVar12] - 0x58));
          cVar25 = '\x03';
        }
        goto LAB_001859a5;
      }
      cVar25 = '\x01';
      if (*(int *)((long)&cb->cx + 4) == 0) goto switchD_00185598_caseD_4;
      uVar9 = *(ushort *)((long)&((compile_block_8 *)code)->cx + 1);
      uVar13 = (ulong)(ushort)(uVar9 << 8 | uVar9 >> 8);
      uVar10 = *(byte *)((long)code - uVar13) - 0x7f;
      pcVar14 = (compile_block_8 *)(ulong)uVar10;
      fcc = pcVar14;
      if (0x10 < uVar10) {
switchD_00185598_caseD_8:
        uVar12 = (ulong)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                        [uVar12];
        goto LAB_001854dc;
      }
      fcc = (compile_block_8 *)
            ((long)&switchD_00185598::switchdataD_001c2b10 +
            (long)(int)(&switchD_00185598::switchdataD_001c2b10)[(long)pcVar14]);
      switch(pcVar14) {
      case (compile_block_8 *)0x0:
      case (compile_block_8 *)0x1:
      case (compile_block_8 *)0x6:
        bVar17 = !bVar6;
        goto LAB_001859f4;
      case (compile_block_8 *)0x2:
      case (compile_block_8 *)0x3:
        bVar17 = !bVar6 && *(PCRE2_SPTR8)((long)code + (3 - uVar13)) != '~';
        fcc = (compile_block_8 *)CONCAT71((int7)((ulong)fcc >> 8),bVar17);
LAB_001859f4:
        uVar26 = (uint)bVar17;
        goto LAB_001859a5;
      case (compile_block_8 *)0x4:
      case (compile_block_8 *)0x5:
        break;
      case (compile_block_8 *)0x7:
        if (*(int *)&cb->cx - 0x1dU < 2) goto switchD_00185598_caseD_8;
        break;
      default:
        goto switchD_00185598_caseD_8;
      case (compile_block_8 *)0xa:
      case (compile_block_8 *)0xb:
      case (compile_block_8 *)0xf:
      case (compile_block_8 *)0x10:
        if (*(int *)(lVar18 + 0x120) == 0) goto switchD_00185598_caseD_8;
      }
switchD_00185598_caseD_4:
      uVar26 = 0;
      cVar25 = '\x01';
LAB_001859a5:
    } while ((cVar25 == '\0') || (cVar25 == '\x03'));
  }
  return uVar26;
}

Assistant:

static BOOL
compare_opcodes(PCRE2_SPTR code, BOOL utf, BOOL ucp, const compile_block *cb,
  const uint32_t *base_list, PCRE2_SPTR base_end, int *rec_limit)
{
PCRE2_UCHAR c;
uint32_t list[8];
const uint32_t *chr_ptr;
const uint32_t *ochr_ptr;
const uint32_t *list_ptr;
PCRE2_SPTR next_code;
#ifdef SUPPORT_WIDE_CHARS
PCRE2_SPTR xclass_flags;
#endif
const uint8_t *class_bitset;
const uint8_t *set1, *set2, *set_end;
uint32_t chr;
BOOL accepted, invert_bits;
BOOL entered_a_group = FALSE;

if (--(*rec_limit) <= 0) return FALSE;  /* Recursion has gone too deep */

/* Note: the base_list[1] contains whether the current opcode has a greedy
(represented by a non-zero value) quantifier. This is a different from
other character type lists, which store here that the character iterator
matches to an empty string (also represented by a non-zero value). */

for(;;)
  {
  PCRE2_SPTR bracode;

  /* All operations move the code pointer forward.
  Therefore infinite recursions are not possible. */

  c = *code;

  /* Skip over callouts */

  if (c == OP_CALLOUT)
    {
    code += PRIV(OP_lengths)[c];
    continue;
    }

  if (c == OP_CALLOUT_STR)
    {
    code += GET(code, 1 + 2*LINK_SIZE);
    continue;
    }

  /* At the end of a branch, skip to the end of the group. */

  if (c == OP_ALT)
    {
    do code += GET(code, 1); while (*code == OP_ALT);
    c = *code;
    }

  /* Inspect the next opcode. */

  switch(c)
    {
    /* We can always possessify a greedy iterator at the end of the pattern,
    which is reached after skipping over the final OP_KET. A non-greedy
    iterator must never be possessified. */

    case OP_END:
    return base_list[1] != 0;

    /* When an iterator is at the end of certain kinds of group we can inspect
    what follows the group by skipping over the closing ket. Note that this
    does not apply to OP_KETRMAX or OP_KETRMIN because what follows any given
    iteration is variable (could be another iteration or could be the next
    item). As these two opcodes are not listed in the next switch, they will
    end up as the next code to inspect, and return FALSE by virtue of being
    unsupported. */

    case OP_KET:
    case OP_KETRPOS:
    /* The non-greedy case cannot be converted to a possessive form. */

    if (base_list[1] == 0) return FALSE;

    /* If the bracket is capturing it might be referenced by an OP_RECURSE
    so its last iterator can never be possessified if the pattern contains
    recursions. (This could be improved by keeping a list of group numbers that
    are called by recursion.) */

    bracode = code - GET(code, 1);
    switch(*bracode)
      {
      case OP_CBRA:
      case OP_SCBRA:
      case OP_CBRAPOS:
      case OP_SCBRAPOS:
      if (cb->had_recurse) return FALSE;
      break;

      /* A script run might have to backtrack if the iterated item can match
      characters from more than one script. So give up unless repeating an
      explicit character. */

      case OP_SCRIPT_RUN:
      if (base_list[0] != OP_CHAR && base_list[0] != OP_CHARI)
        return FALSE;
      break;

      /* Atomic sub-patterns and assertions can always auto-possessify their
      last iterator except for variable length lookbehinds. However, if the
      group was entered as a result of checking a previous iterator, this is
      not possible. */

      case OP_ASSERT:
      case OP_ASSERT_NOT:
      case OP_ONCE:
      return !entered_a_group;

      case OP_ASSERTBACK:
      case OP_ASSERTBACK_NOT:
      return (bracode[1+LINK_SIZE] == OP_VREVERSE)? FALSE : !entered_a_group;

      /* Non-atomic assertions - don't possessify last iterator. This needs
      more thought. */

      case OP_ASSERT_NA:
      case OP_ASSERTBACK_NA:
      return FALSE;
      }

    /* Skip over the bracket and inspect what comes next. */

    code += PRIV(OP_lengths)[c];
    continue;

    /* Handle cases where the next item is a group. */

    case OP_ONCE:
    case OP_BRA:
    case OP_CBRA:
    next_code = code + GET(code, 1);
    code += PRIV(OP_lengths)[c];

    /* Check each branch. We have to recurse a level for all but the last
    branch. */

    while (*next_code == OP_ALT)
      {
      if (!compare_opcodes(code, utf, ucp, cb, base_list, base_end, rec_limit))
        return FALSE;
      code = next_code + 1 + LINK_SIZE;
      next_code += GET(next_code, 1);
      }

    entered_a_group = TRUE;
    continue;

    case OP_BRAZERO:
    case OP_BRAMINZERO:

    next_code = code + 1;
    if (*next_code != OP_BRA && *next_code != OP_CBRA &&
        *next_code != OP_ONCE) return FALSE;

    do next_code += GET(next_code, 1); while (*next_code == OP_ALT);

    /* The bracket content will be checked by the OP_BRA/OP_CBRA case above. */

    next_code += 1 + LINK_SIZE;
    if (!compare_opcodes(next_code, utf, ucp, cb, base_list, base_end,
         rec_limit))
      return FALSE;

    code += PRIV(OP_lengths)[c];
    continue;

    /* The next opcode does not need special handling; fall through and use it
    to see if the base can be possessified. */

    default:
    break;
    }

  /* We now have the next appropriate opcode to compare with the base. Check
  for a supported opcode, and load its properties. */

  code = get_chr_property_list(code, utf, ucp, cb->fcc, list);
  if (code == NULL) return FALSE;    /* Unsupported */

  /* If either opcode is a small character list, set pointers for comparing
  characters from that list with another list, or with a property. */

  if (base_list[0] == OP_CHAR)
    {
    chr_ptr = base_list + 2;
    list_ptr = list;
    }
  else if (list[0] == OP_CHAR)
    {
    chr_ptr = list + 2;
    list_ptr = base_list;
    }

  /* Character bitsets can also be compared to certain opcodes. */

  else if (base_list[0] == OP_CLASS || list[0] == OP_CLASS
#if PCRE2_CODE_UNIT_WIDTH == 8
      /* In 8 bit, non-UTF mode, OP_CLASS and OP_NCLASS are the same. */
      || (!utf && (base_list[0] == OP_NCLASS || list[0] == OP_NCLASS))
#endif
      )
    {
#if PCRE2_CODE_UNIT_WIDTH == 8
    if (base_list[0] == OP_CLASS || (!utf && base_list[0] == OP_NCLASS))
#else
    if (base_list[0] == OP_CLASS)
#endif
      {
      set1 = (uint8_t *)(base_end - base_list[2]);
      list_ptr = list;
      }
    else
      {
      set1 = (uint8_t *)(code - list[2]);
      list_ptr = base_list;
      }

    invert_bits = FALSE;
    switch(list_ptr[0])
      {
      case OP_CLASS:
      case OP_NCLASS:
      set2 = (uint8_t *)
        ((list_ptr == list ? code : base_end) - list_ptr[2]);
      break;

#ifdef SUPPORT_WIDE_CHARS
      case OP_XCLASS:
      xclass_flags = (list_ptr == list ? code : base_end) - list_ptr[2] + LINK_SIZE;
      if ((*xclass_flags & XCL_HASPROP) != 0) return FALSE;
      if ((*xclass_flags & XCL_MAP) == 0)
        {
        /* No bits are set for characters < 256. */
        if (list[1] == 0) return (*xclass_flags & XCL_NOT) == 0;
        /* Might be an empty repeat. */
        continue;
        }
      set2 = (uint8_t *)(xclass_flags + 1);
      break;
#endif

      case OP_NOT_DIGIT:
      invert_bits = TRUE;
      /* Fall through */
      case OP_DIGIT:
      set2 = (uint8_t *)(cb->cbits + cbit_digit);
      break;

      case OP_NOT_WHITESPACE:
      invert_bits = TRUE;
      /* Fall through */
      case OP_WHITESPACE:
      set2 = (uint8_t *)(cb->cbits + cbit_space);
      break;

      case OP_NOT_WORDCHAR:
      invert_bits = TRUE;
      /* Fall through */
      case OP_WORDCHAR:
      set2 = (uint8_t *)(cb->cbits + cbit_word);
      break;

      default:
      return FALSE;
      }

    /* Because the bit sets are unaligned bytes, we need to perform byte
    comparison here. */

    set_end = set1 + 32;
    if (invert_bits)
      {
      do
        {
        if ((*set1++ & ~(*set2++)) != 0) return FALSE;
        }
      while (set1 < set_end);
      }
    else
      {
      do
        {
        if ((*set1++ & *set2++) != 0) return FALSE;
        }
      while (set1 < set_end);
      }

    if (list[1] == 0) return TRUE;
    /* Might be an empty repeat. */
    continue;
    }

  /* Some property combinations also acceptable. Unicode property opcodes are
  processed specially; the rest can be handled with a lookup table. */

  else
    {
    uint32_t leftop, rightop;

    leftop = base_list[0];
    rightop = list[0];

#ifdef SUPPORT_UNICODE
    accepted = FALSE; /* Always set in non-unicode case. */
    if (leftop == OP_PROP || leftop == OP_NOTPROP)
      {
      if (rightop == OP_EOD)
        accepted = TRUE;
      else if (rightop == OP_PROP || rightop == OP_NOTPROP)
        {
        int n;
        const uint8_t *p;
        BOOL same = leftop == rightop;
        BOOL lisprop = leftop == OP_PROP;
        BOOL risprop = rightop == OP_PROP;
        BOOL bothprop = lisprop && risprop;

        /* There's a table that specifies how each combination is to be
        processed:
          0   Always return FALSE (never auto-possessify)
          1   Character groups are distinct (possessify if both are OP_PROP)
          2   Check character categories in the same group (general or particular)
          3   Return TRUE if the two opcodes are not the same
          ... see comments below
        */

        n = propposstab[base_list[2]][list[2]];
        switch(n)
          {
          case 0: break;
          case 1: accepted = bothprop; break;
          case 2: accepted = (base_list[3] == list[3]) != same; break;
          case 3: accepted = !same; break;

          case 4:  /* Left general category, right particular category */
          accepted = risprop && catposstab[base_list[3]][list[3]] == same;
          break;

          case 5:  /* Right general category, left particular category */
          accepted = lisprop && catposstab[list[3]][base_list[3]] == same;
          break;

          /* This code is logically tricky. Think hard before fiddling with it.
          The posspropstab table has four entries per row. Each row relates to
          one of PCRE's special properties such as ALNUM or SPACE or WORD.
          Only WORD actually needs all four entries, but using repeats for the
          others means they can all use the same code below.

          The first two entries in each row are Unicode general categories, and
          apply always, because all the characters they include are part of the
          PCRE character set. The third and fourth entries are a general and a
          particular category, respectively, that include one or more relevant
          characters. One or the other is used, depending on whether the check
          is for a general or a particular category. However, in both cases the
          category contains more characters than the specials that are defined
          for the property being tested against. Therefore, it cannot be used
          in a NOTPROP case.

          Example: the row for WORD contains ucp_L, ucp_N, ucp_P, ucp_Po.
          Underscore is covered by ucp_P or ucp_Po. */

          case 6:  /* Left alphanum vs right general category */
          case 7:  /* Left space vs right general category */
          case 8:  /* Left word vs right general category */
          p = posspropstab[n-6];
          accepted = risprop && lisprop ==
            (list[3] != p[0] &&
             list[3] != p[1] &&
            (list[3] != p[2] || !lisprop));
          break;

          case 9:   /* Right alphanum vs left general category */
          case 10:  /* Right space vs left general category */
          case 11:  /* Right word vs left general category */
          p = posspropstab[n-9];
          accepted = lisprop && risprop ==
            (base_list[3] != p[0] &&
             base_list[3] != p[1] &&
            (base_list[3] != p[2] || !risprop));
          break;

          case 12:  /* Left alphanum vs right particular category */
          case 13:  /* Left space vs right particular category */
          case 14:  /* Left word vs right particular category */
          p = posspropstab[n-12];
          accepted = risprop && lisprop ==
            (catposstab[p[0]][list[3]] &&
             catposstab[p[1]][list[3]] &&
            (list[3] != p[3] || !lisprop));
          break;

          case 15:  /* Right alphanum vs left particular category */
          case 16:  /* Right space vs left particular category */
          case 17:  /* Right word vs left particular category */
          p = posspropstab[n-15];
          accepted = lisprop && risprop ==
            (catposstab[p[0]][base_list[3]] &&
             catposstab[p[1]][base_list[3]] &&
            (base_list[3] != p[3] || !risprop));
          break;
          }
        }
      }

    else
#endif  /* SUPPORT_UNICODE */

    accepted = leftop >= FIRST_AUTOTAB_OP && leftop <= LAST_AUTOTAB_LEFT_OP &&
           rightop >= FIRST_AUTOTAB_OP && rightop <= LAST_AUTOTAB_RIGHT_OP &&
           autoposstab[leftop - FIRST_AUTOTAB_OP][rightop - FIRST_AUTOTAB_OP];

    if (!accepted) return FALSE;

    if (list[1] == 0) return TRUE;
    /* Might be an empty repeat. */
    continue;
    }

  /* Control reaches here only if one of the items is a small character list.
  All characters are checked against the other side. */

  do
    {
    chr = *chr_ptr;

    switch(list_ptr[0])
      {
      case OP_CHAR:
      ochr_ptr = list_ptr + 2;
      do
        {
        if (chr == *ochr_ptr) return FALSE;
        ochr_ptr++;
        }
      while(*ochr_ptr != NOTACHAR);
      break;

      case OP_NOT:
      ochr_ptr = list_ptr + 2;
      do
        {
        if (chr == *ochr_ptr)
          break;
        ochr_ptr++;
        }
      while(*ochr_ptr != NOTACHAR);
      if (*ochr_ptr == NOTACHAR) return FALSE;   /* Not found */
      break;

      /* Note that OP_DIGIT etc. are generated only when PCRE2_UCP is *not*
      set. When it is set, \d etc. are converted into OP_(NOT_)PROP codes. */

      case OP_DIGIT:
      if (chr < 256 && (cb->ctypes[chr] & ctype_digit) != 0) return FALSE;
      break;

      case OP_NOT_DIGIT:
      if (chr > 255 || (cb->ctypes[chr] & ctype_digit) == 0) return FALSE;
      break;

      case OP_WHITESPACE:
      if (chr < 256 && (cb->ctypes[chr] & ctype_space) != 0) return FALSE;
      break;

      case OP_NOT_WHITESPACE:
      if (chr > 255 || (cb->ctypes[chr] & ctype_space) == 0) return FALSE;
      break;

      case OP_WORDCHAR:
      if (chr < 255 && (cb->ctypes[chr] & ctype_word) != 0) return FALSE;
      break;

      case OP_NOT_WORDCHAR:
      if (chr > 255 || (cb->ctypes[chr] & ctype_word) == 0) return FALSE;
      break;

      case OP_HSPACE:
      switch(chr)
        {
        HSPACE_CASES: return FALSE;
        default: break;
        }
      break;

      case OP_NOT_HSPACE:
      switch(chr)
        {
        HSPACE_CASES: break;
        default: return FALSE;
        }
      break;

      case OP_ANYNL:
      case OP_VSPACE:
      switch(chr)
        {
        VSPACE_CASES: return FALSE;
        default: break;
        }
      break;

      case OP_NOT_VSPACE:
      switch(chr)
        {
        VSPACE_CASES: break;
        default: return FALSE;
        }
      break;

      case OP_DOLL:
      case OP_EODN:
      switch (chr)
        {
        case CHAR_CR:
        case CHAR_LF:
        case CHAR_VT:
        case CHAR_FF:
        case CHAR_NEL:
#ifndef EBCDIC
        case 0x2028:
        case 0x2029:
#endif  /* Not EBCDIC */
        return FALSE;
        }
      break;

      case OP_EOD:    /* Can always possessify before \z */
      break;

#ifdef SUPPORT_UNICODE
      case OP_PROP:
      case OP_NOTPROP:
      if (!check_char_prop(chr, list_ptr[2], list_ptr[3],
            list_ptr[0] == OP_NOTPROP))
        return FALSE;
      break;
#endif

      case OP_NCLASS:
      if (chr > 255) return FALSE;
      /* Fall through */

      case OP_CLASS:
      if (chr > 255) break;
      class_bitset = (uint8_t *)
        ((list_ptr == list ? code : base_end) - list_ptr[2]);
      if ((class_bitset[chr >> 3] & (1u << (chr & 7))) != 0) return FALSE;
      break;

#ifdef SUPPORT_WIDE_CHARS
      case OP_XCLASS:
      if (PRIV(xclass)(chr, (list_ptr == list ? code : base_end) -
          list_ptr[2] + LINK_SIZE, utf)) return FALSE;
      break;
#endif

      default:
      return FALSE;
      }

    chr_ptr++;
    }
  while(*chr_ptr != NOTACHAR);

  /* At least one character must be matched from this opcode. */

  if (list[1] == 0) return TRUE;
  }

/* Control never reaches here. There used to be a fail-save return FALSE; here,
but some compilers complain about an unreachable statement. */
}